

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

int lest::version(ostream *os)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"lest version ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(os,"1.35.1",6);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Compiled with ",0xe);
  compiler_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," on ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Apr 26 2025",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"19:43:35",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"For more information, see https://github.com/martinmoene/lest.\n",0x3f);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 0;
}

Assistant:

inline int version( std::ostream & os )
{
    os << "lest version "  << lest_VERSION << "\n"
       << "Compiled with " << compiler()   << " on " << __DATE__ << " at " << __TIME__ << ".\n"
       << "For more information, see https://github.com/martinmoene/lest.\n";
    return 0;
}